

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O1

void __thiscall QNetworkRequest::setAttribute(QNetworkRequest *this,Attribute code,QVariant *value)

{
  QNetworkRequestPrivate *pQVar1;
  long in_FS_OFFSET;
  Attribute copy;
  Attribute local_20;
  Attribute local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  local_20 = code;
  if (*(ulong *)&(value->d).field_0x18 < 4) {
    if ((pQVar1 != (QNetworkRequestPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
    }
    QHash<QNetworkRequest::Attribute,_QVariant>::removeImpl<QNetworkRequest::Attribute>
              (&(((this->d).d.ptr)->super_QNetworkHeadersPrivate).attributes,&local_20);
  }
  else {
    if ((pQVar1 != (QNetworkRequestPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
    }
    local_1c = local_20;
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)
               &(((this->d).d.ptr)->super_QNetworkHeadersPrivate).attributes,&local_1c,value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkRequest::setAttribute(Attribute code, const QVariant &value)
{
    if (value.isValid())
        d->attributes.insert(code, value);
    else
        d->attributes.remove(code);
}